

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

string * __thiscall
vkt::tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Winding winding,
          bool usePointMode)

{
  char *pcVar1;
  size_t sVar2;
  string *psVar3;
  long lVar4;
  char *__s;
  bool bVar5;
  ostringstream str;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"winding mode ",0xd);
  pcVar1 = (char *)0x0;
  if ((int)this == 1) {
    pcVar1 = "cw";
  }
  __s = "ccw";
  if ((int)this != 0) {
    __s = pcVar1;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,", ",2);
  pcVar1 = "don\'t ";
  bVar5 = (char)winding != '\0';
  if (bVar5) {
    pcVar1 = "";
  }
  lVar4 = 6;
  if (bVar5) {
    lVar4 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar1,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"use point mode",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  psVar3 = (string *)std::ios_base::~ios_base(local_128);
  return psVar3;
}

Assistant:

inline std::string getProgramDescription (const Winding winding, const bool usePointMode)
{
	std::ostringstream str;
	str << "winding mode " << getWindingShaderName(winding) << ", " << (usePointMode ? "" : "don't ") << "use point mode";
	return str.str();
}